

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void __thiscall chaiscript::detail::Dispatch_Function::~Dispatch_Function(Dispatch_Function *this)

{
  std::
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  ::~vector(&this->m_funcs);
  dispatch::Proxy_Function_Base::~Proxy_Function_Base(&this->super_Proxy_Function_Base);
  return;
}

Assistant:

explicit Dispatch_Function(std::vector<Proxy_Function> t_funcs)
          : Proxy_Function_Base(build_type_infos(t_funcs), calculate_arity(t_funcs))
          , m_funcs(std::move(t_funcs)) {
      }